

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O3

int __thiscall soplex::LPRowSetBase<double>::remove(LPRowSetBase<double> *this,char *__filename)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int *piVar4;
  int extraout_EAX;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(this->super_SVSetBase<double>).set.thenum;
  SVSetBase<double>::remove(&this->super_SVSetBase<double>,__filename);
  if (0 < (long)uVar7) {
    pdVar1 = (this->left).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->right).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->scaleExp).data;
    uVar5 = 0;
    do {
      uVar6 = (ulong)*(uint *)(__filename + uVar5 * 4);
      if (uVar5 != uVar6 && -1 < (int)*(uint *)(__filename + uVar5 * 4)) {
        pdVar1[uVar6] = pdVar1[uVar5];
        pdVar2[uVar6] = pdVar2[uVar5];
        pdVar3[uVar6] = pdVar3[uVar5];
        piVar4[uVar6] = piVar4[uVar5];
      }
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  VectorBase<double>::reDim(&this->left,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->right,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
  DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum);
  return extraout_EAX;
}

Assistant:

void remove(int perm[])
   {
      int j = num();

      SVSetBase<R>::remove(perm);

      for(int i = 0; i < j; ++i)
      {
         if(perm[i] >= 0 && perm[i] != i)
         {
            left[perm[i]] = left[i];
            right[perm[i]] = right[i];
            object[perm[i]] = object[i];
            scaleExp[perm[i]] = scaleExp[i];
         }
      }

      left.reDim(num());
      right.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }